

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

ReduceMinLayerParams * __thiscall
CoreML::Specification::ReduceMinLayerParams::New(ReduceMinLayerParams *this,Arena *arena)

{
  ReduceMinLayerParams *this_00;
  
  this_00 = (ReduceMinLayerParams *)operator_new(0x30);
  ReduceMinLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReduceMinLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReduceMinLayerParams* ReduceMinLayerParams::New(::google::protobuf::Arena* arena) const {
  ReduceMinLayerParams* n = new ReduceMinLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}